

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCast::Operation<duckdb::string_t,short>(string_t input,int16_t *result,bool strict)

{
  bool bVar1;
  undefined1 in_CL;
  undefined8 in_RSI;
  undefined8 in_RDI;
  idx_t unaff_retaddr;
  undefined7 in_stack_00000008;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 strict_00;
  
  strict_00 = (undefined1)((ulong)in_RDI >> 0x38);
  string_t::GetData((string_t *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  string_t::GetSize((string_t *)&stack0xfffffffffffffff0);
  bVar1 = TrySimpleIntegerCast<short,true>
                    ((char *)CONCAT17(strict,in_stack_00000008),unaff_retaddr,(short *)in_RSI,
                     (bool)strict_00);
  return bVar1;
}

Assistant:

bool TryCast::Operation(string_t input, int16_t &result, bool strict) {
	return TrySimpleIntegerCast<int16_t>(input.GetData(), input.GetSize(), result, strict);
}